

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg.cpp
# Opt level: O0

MPP_RET mpp_sys_dec_buf_chk_proc(MppSysDecBufChkCfg *cfg)

{
  MppCodingType MVar1;
  MppFrameFormat MVar2;
  MppFrameFormat MVar3;
  int iVar4;
  uint uVar5;
  RockchipSocType RVar6;
  RK_U32 val;
  bool bVar7;
  RK_U32 local_80;
  RK_U32 local_68;
  RK_U32 local_64;
  RK_U32 local_60;
  RK_U32 local_5c;
  SysCfgAlignType local_50;
  SysCfgAlignType local_4c;
  SysCfgAlignType align_type_1;
  SysCfgAlignType align_type;
  rk_s32 update;
  RockchipSocType soc_type;
  RK_U32 depth;
  RK_U32 size_total_old;
  RK_U32 size_total;
  RK_U32 aligned_height;
  RK_U32 aligned_byte;
  RK_U32 aligned_pixel_byte;
  RK_U32 aligned_pixel;
  MppFrameFormat fmt_raw;
  MppFrameFormat fmt;
  MppCodingType type;
  MppSysDecBufChkCfg *cfg_local;
  
  MVar1 = cfg->type;
  MVar3 = cfg->fmt_codec & 0xfffff;
  uVar5 = cfg->fmt_fbc;
  MVar2 = cfg->fmt_codec;
  size_total_old = 0;
  bVar7 = true;
  if ((MVar3 != MPP_FMT_YUV420SP_10BIT) && (bVar7 = true, MVar3 != MPP_FMT_YUV422SP_10BIT)) {
    bVar7 = MVar3 == MPP_FMT_YUV444SP_10BIT;
  }
  iVar4 = 8;
  if (bVar7) {
    iVar4 = 10;
  }
  if (MVar1 == MPP_VIDEO_CodingUnused) {
    _mpp_log_l(2,"mpp_sys_cfg","The coding type is invalid",(char *)0x0);
    return MPP_NOK;
  }
  if (cfg->v_stride != 0) {
    size_total_old = cfg->v_stride;
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","org pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)cfg->width,(ulong)cfg->height);
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","outside stride wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)cfg->h_stride_by_byte,(ulong)cfg->v_stride);
  }
  if ((uVar5 & 0xf00000) != 0) {
    if (MVar1 == MPP_VIDEO_CodingAVC) {
LAB_0013a1c9:
      aligned_byte = cfg->width + 0x3f & 0xffffffc0;
      if (size_total_old == 0) {
        local_60 = cfg->height;
      }
      else {
        local_60 = size_total_old;
      }
      size_total_old = local_60 + 0xf & 0xfffffff0;
    }
    else if (MVar1 == MPP_VIDEO_CodingVP9) {
      aligned_byte = cfg->width + 0x3f & 0xffffffc0;
      if (size_total_old == 0) {
        local_64 = cfg->height;
      }
      else {
        local_64 = size_total_old;
      }
      size_total_old = local_64 + 0x3f & 0xffffffc0;
    }
    else {
      if (MVar1 != MPP_VIDEO_CodingHEVC) {
        if (MVar1 + ~MPP_VIDEO_CodingHEVC < 3) goto LAB_0013a1c9;
        if (MVar1 != MPP_VIDEO_CodingAV1) {
          aligned_byte = cfg->width + 0xf & 0xfffffff0;
          if (size_total_old == 0) {
            local_68 = cfg->height;
          }
          else {
            local_68 = size_total_old;
          }
          size_total_old = local_68 + 0xf & 0xfffffff0;
          goto LAB_0013a27b;
        }
      }
      aligned_byte = cfg->width + 0x3f & 0xffffffc0;
      if (size_total_old == 0) {
        local_5c = cfg->height;
      }
      else {
        local_5c = size_total_old;
      }
      size_total_old = local_5c + 0xf & 0xfffffff0;
    }
LAB_0013a27b:
    if ((mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","spec aligned pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)aligned_byte,(ulong)size_total_old);
    }
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      uVar5 = aligned_byte + 0x3f & 0xffffffc0;
    }
    else {
      uVar5 = aligned_byte + 0xff & 0xffffff00 | 0x100;
    }
    aligned_height = uVar5 * iVar4 >> 3;
    if ((mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","need 256 odd align: %d\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)(uint)*compat_ext_fbc_hdr_256_odd);
    }
    if (MVar1 != MPP_VIDEO_CodingAVC) {
      if (MVar1 == MPP_VIDEO_CodingVP9) {
        size_total = aligned_height + 0x3f & 0xffffffc0;
        goto LAB_0013a3d3;
      }
      if (MVar1 == MPP_VIDEO_CodingHEVC) {
        size_total = aligned_height + 0x3f & 0xffffffc0;
        goto LAB_0013a3d3;
      }
      if (2 < MVar1 + ~MPP_VIDEO_CodingHEVC) {
        if (MVar1 == MPP_VIDEO_CodingAV1) {
          size_total = aligned_height;
        }
        else {
          size_total = aligned_height;
        }
        goto LAB_0013a3d3;
      }
    }
    size_total = aligned_height + 0x3f & 0xffffffc0;
LAB_0013a3d3:
    if ((mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","dec hw aligned hor_byte: [%d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)size_total);
    }
    cfg->h_stride_by_byte = size_total;
    cfg->h_stride_by_pixel = aligned_byte;
    cfg->v_stride = size_total_old;
    switch(MVar2 & 0xfffff) {
    case MPP_FMT_YUV420SP:
      depth = get_afbc_min_size(aligned_byte,size_total_old,0xc);
      break;
    case MPP_FMT_YUV420SP_10BIT:
      depth = get_afbc_min_size(aligned_byte,size_total_old,0xf);
      break;
    case MPP_FMT_YUV422SP:
      depth = get_afbc_min_size(aligned_byte,size_total_old,0x10);
      break;
    case MPP_FMT_YUV422SP_10BIT:
      depth = get_afbc_min_size(aligned_byte,size_total_old,0x14);
      break;
    default:
      depth = size_total * size_total_old * 3 >> 1;
      _mpp_log_l(2,"mpp_sys_cfg","dec out fmt 0x%x is no support",(char *)0x0,
                 (ulong)(MVar2 & 0xfffff));
      break;
    case MPP_FMT_YUV444SP:
      depth = get_afbc_min_size(aligned_byte,size_total_old,0x18);
    }
    if ((mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","res aligned_pixel %d\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)aligned_byte);
    }
    if ((mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","res aligned_byte %d\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)size_total);
    }
    if ((mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","res aligned_height %d\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)size_total_old);
    }
    if ((mpp_sys_cfg_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_sys_cfg","res GPU aligned size_total: [%d]\n","mpp_sys_dec_buf_chk_proc",
                 (ulong)depth);
    }
    cfg->size_total = depth;
    return MPP_OK;
  }
  RVar6 = mpp_get_soc_type();
  aligned_byte = cfg->width;
  if (MVar1 - MPP_VIDEO_CodingMPEG2 < 3) {
LAB_0013a724:
    size_total_old = cfg->height + 0xf & 0xfffffff0;
  }
  else if (MVar1 == MPP_VIDEO_CodingAVC) {
    aligned_byte = cfg->width + 0xf & 0xfffffff0;
    size_total_old = cfg->height + 0xf & 0xfffffff0;
  }
  else {
    if (MVar1 == MPP_VIDEO_CodingVP8) goto LAB_0013a724;
    if (MVar1 == MPP_VIDEO_CodingVP9) {
      if (RVar6 == ROCKCHIP_SOC_RK3399) {
        size_total_old = cfg->height + 0x3f & 0xffffffc0;
      }
      else if (RVar6 == ROCKCHIP_SOC_RK3588) {
        size_total_old = cfg->height + 0xf & 0xfffffff0;
      }
      else {
        size_total_old = cfg->height + 7 & 0xfffffff8;
      }
    }
    else if (MVar1 == MPP_VIDEO_CodingHEVC) {
      aligned_byte = cfg->width + 0x3f & 0xffffffc0;
      size_total_old = cfg->height + 7 & 0xfffffff8;
    }
    else if (MVar1 == MPP_VIDEO_CodingAVS2) {
      aligned_byte = cfg->width + 0x3f & 0xffffffc0;
      size_total_old = cfg->height + 7 & 0xfffffff8;
    }
    else if (MVar1 == MPP_VIDEO_CodingAV1) {
      size_total_old = cfg->height + 7 & 0xfffffff8;
    }
    else {
      size_total_old = cfg->height + 7 & 0xfffffff8;
    }
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","spec aligned pixel wxh: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)aligned_byte,(ulong)size_total_old);
  }
  if (cfg->h_stride_by_byte == 0) {
    local_80 = aligned_byte * iVar4 >> 3;
  }
  else {
    local_80 = cfg->h_stride_by_byte;
  }
  if (MVar1 == MPP_VIDEO_CodingVP9) {
    if (RVar6 == ROCKCHIP_SOC_RK3576) {
      size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64,local_80);
    }
    else {
      size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD,local_80);
    }
  }
  else if (MVar1 == MPP_VIDEO_CodingHEVC) {
    size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_64,local_80);
  }
  else if (MVar1 == MPP_VIDEO_CodingAV1) {
    if (RVar6 == ROCKCHIP_SOC_RK3588) {
      size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_16,local_80);
    }
    else {
      size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_128,local_80);
    }
  }
  else {
    size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_16,local_80);
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","dec hw aligned hor_byte: [%d %d]\n","mpp_sys_dec_buf_chk_proc",
               (ulong)size_total);
  }
  if ((((size_total < 0x781) && (RVar6 != ROCKCHIP_SOC_RK3576)) && (RVar6 != ROCKCHIP_SOC_RK3399))
     || (MVar1 == MPP_VIDEO_CodingMJPEG)) goto LAB_0013a9d8;
  bVar7 = false;
  if ((RVar6 == ROCKCHIP_SOC_RK3399) || (RVar6 - ROCKCHIP_SOC_RK3568 < 4)) {
    size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD,size_total);
    bVar7 = true;
  }
  else if (RVar6 == ROCKCHIP_SOC_RK3576) {
    size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64,size_total);
    bVar7 = true;
  }
  if (!bVar7) goto LAB_0013a9d8;
  if ((MVar3 == MPP_FMT_YUV420SP_10BIT) || (MVar3 == MPP_FMT_YUV422SP_10BIT)) {
LAB_0013a99f:
    aligned_byte = (size_total << 3) / 10;
  }
  else {
    if (1 < MVar3 - MPP_FMT_YUV422_YUYV) {
      if (MVar3 == MPP_FMT_YUV444SP_10BIT) goto LAB_0013a99f;
      if (1 < MVar3 - MPP_FMT_RGB565) {
        if (MVar3 - MPP_FMT_RGB888 < 2) {
          aligned_byte = size_total / 3;
        }
        else {
          aligned_byte = size_total;
        }
        goto LAB_0013a9d8;
      }
    }
    aligned_byte = size_total >> 1;
  }
LAB_0013a9d8:
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","dec hw performance aligned hor_byte: [%d]\n",
               "mpp_sys_dec_buf_chk_proc",(ulong)aligned_byte);
  }
  cfg->h_stride_by_byte = size_total;
  cfg->h_stride_by_pixel = aligned_byte;
  cfg->v_stride = size_total_old;
  val = size_total * size_total_old;
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","fmt_raw %x\n","mpp_sys_dec_buf_chk_proc",(ulong)MVar2);
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","res aligned_pixel %d\n","mpp_sys_dec_buf_chk_proc",
               (ulong)aligned_byte);
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","res aligned_byte %d\n","mpp_sys_dec_buf_chk_proc",(ulong)size_total)
    ;
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","res aligned_height %d\n","mpp_sys_dec_buf_chk_proc",
               (ulong)size_total_old);
  }
  switch(MVar2) {
  case MPP_FMT_YUV420SP:
  case MPP_FMT_YUV420SP_10BIT:
  case MPP_FMT_YUV420P:
  case MPP_FMT_YUV420SP_VU:
    local_4c = SYS_CFG_ALIGN_LEN_DEFAULT;
    if (MVar1 == MPP_VIDEO_CodingAV1) {
      local_4c = SYS_CFG_ALIGN_LEN_420_AV1;
    }
    else if (MVar1 == MPP_VIDEO_CodingAVC) {
      local_4c = SYS_CFG_ALIGN_LEN_420;
    }
    depth = mpp_sys_cfg_align(local_4c,val);
    break;
  case MPP_FMT_YUV422SP:
  case MPP_FMT_YUV422SP_10BIT:
  case MPP_FMT_YUV422P:
  case MPP_FMT_YUV422SP_VU:
  case MPP_FMT_YUV422_YUYV:
  case MPP_FMT_YUV422_YVYU:
  case MPP_FMT_YUV422_UYVY:
  case MPP_FMT_YUV422_VYUY:
  case MPP_FMT_YUV440SP:
  case MPP_FMT_YUV411SP:
    if (MVar1 == MPP_VIDEO_CodingAVC) {
      local_50 = SYS_CFG_ALIGN_LEN_422_AVC;
    }
    else if (MVar1 == MPP_VIDEO_CodingAV1) {
      local_50 = SYS_CFG_ALIGN_LEN_422_AV1;
    }
    else {
      local_50 = SYS_CFG_ALIGN_LEN_422;
    }
    depth = mpp_sys_cfg_align(local_50,val);
    break;
  case MPP_FMT_YUV400:
    depth = val;
    break;
  case MPP_FMT_YUV444SP:
  case MPP_FMT_YUV444P:
  case MPP_FMT_YUV444SP_10BIT:
    depth = mpp_sys_cfg_align(SYS_CFG_ALIGN_LEN_444,val);
    break;
  default:
    depth = val * 3 >> 1;
  }
  if ((mpp_sys_cfg_debug & 0x10) != 0) {
    _mpp_log_l(4,"mpp_sys_cfg","res size total %d -> %d\n","mpp_sys_dec_buf_chk_proc",(ulong)val,
               (ulong)depth);
  }
  cfg->size_total = depth;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_sys_dec_buf_chk_proc(MppSysDecBufChkCfg *cfg)
{
    MppCodingType type = cfg->type;
    MppFrameFormat fmt = (MppFrameFormat)(((RK_U32)cfg->fmt_codec & MPP_FRAME_FMT_MASK) |
                                          (cfg->fmt_fbc & MPP_FRAME_FBC_MASK) |
                                          (cfg->fmt_hdr & MPP_FRAME_HDR_MASK));
    MppFrameFormat fmt_raw = cfg->fmt_codec;

    RK_U32 aligned_pixel = 0;
    RK_U32 aligned_pixel_byte = 0;
    RK_U32 aligned_byte = 0;
    RK_U32 aligned_height = 0;
    RK_U32 size_total = 0;
    RK_U32 size_total_old = 0;
    RK_U32 depth = MPP_FRAME_FMT_IS_YUV_10BIT(fmt) ? 10 : 8;

    if (type == MPP_VIDEO_CodingUnused) {
        mpp_err("The coding type is invalid");
        return MPP_NOK;
    }

    /* use codec stride */
    if (cfg->h_stride_by_byte)
        aligned_pixel = cfg->h_stride_by_byte * 8 / depth;
    if (cfg->v_stride)
        aligned_height = cfg->v_stride;

    sys_cfg_dbg_dec_buf("org pixel wxh: [%d %d]\n", cfg->width, cfg->height);
    sys_cfg_dbg_dec_buf("outside stride wxh: [%d %d]\n",
                        cfg->h_stride_by_byte, cfg->v_stride);
    if (MPP_FRAME_FMT_IS_FBC(fmt)) {
        /* fbc case */
        switch (type) {
        case MPP_VIDEO_CodingHEVC :
        case MPP_VIDEO_CodingAV1 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingAVC :
        case MPP_VIDEO_CodingAVSPLUS :
        case MPP_VIDEO_CodingAVS :
        case MPP_VIDEO_CodingAVS2 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 64);
        } break;
        default : {
            aligned_pixel = MPP_ALIGN(cfg->width, 16);
            aligned_height = MPP_ALIGN(aligned_height ? aligned_height : cfg->height, 16);
        } break;
        }
        sys_cfg_dbg_dec_buf("spec aligned pixel wxh: [%d %d]\n", aligned_pixel, aligned_height);

        /*fbc stride default 64 align*/
        if (*compat_ext_fbc_hdr_256_odd)
            aligned_pixel_byte = (MPP_ALIGN(aligned_pixel, 256) | 256) * depth >> 3;
        else
            aligned_pixel_byte = MPP_ALIGN(aligned_pixel, 64) * depth >> 3;
        sys_cfg_dbg_dec_buf("need 256 odd align: %d\n", *compat_ext_fbc_hdr_256_odd);

        switch (type) {
        case MPP_VIDEO_CodingAVC :
        case MPP_VIDEO_CodingAVSPLUS :
        case MPP_VIDEO_CodingAVS :
        case MPP_VIDEO_CodingAVS2 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingHEVC : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 64);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 16);
        } break;
        default : {
            aligned_byte = MPP_ALIGN(aligned_pixel_byte, 16);
        } break;
        }
        sys_cfg_dbg_dec_buf("dec hw aligned hor_byte: [%d]\n", aligned_byte);

        cfg->h_stride_by_byte = aligned_byte;
        cfg->h_stride_by_pixel = aligned_pixel;
        cfg->v_stride = aligned_height;

        switch ((fmt_raw & MPP_FRAME_FMT_MASK)) {
        case MPP_FMT_YUV420SP_10BIT : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 15);
        } break;
        case MPP_FMT_YUV422SP_10BIT : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 20);
        } break;
        case MPP_FMT_YUV420SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 12);
        } break;
        case MPP_FMT_YUV422SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 16);
        } break;
        case MPP_FMT_YUV444SP : {
            size_total = get_afbc_min_size(aligned_pixel, aligned_height, 24);
        } break;
        default : {
            size_total = aligned_byte * aligned_height * 3 / 2;
            mpp_err("dec out fmt 0x%x is no support", fmt_raw & MPP_FRAME_FMT_MASK);
        } break;
        }
        sys_cfg_dbg_dec_buf("res aligned_pixel %d\n", aligned_pixel);
        sys_cfg_dbg_dec_buf("res aligned_byte %d\n", aligned_byte);
        sys_cfg_dbg_dec_buf("res aligned_height %d\n", aligned_height);
        sys_cfg_dbg_dec_buf("res GPU aligned size_total: [%d]\n", size_total);

        cfg->size_total = size_total;
    } else {
        /* tile case */
        /* raster case */
        RockchipSocType soc_type = mpp_get_soc_type();

        aligned_pixel = cfg->width;
        switch (type) {
        case MPP_VIDEO_CodingHEVC : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        /*
         * avc aligned to ctu
         * p_Vid->width = p_Vid->PicWidthInMbs * 16
         * p_Vid->height = p_Vid->FrameHeightInMbs * 16
         */
        case MPP_VIDEO_CodingAVC : {
            aligned_pixel = MPP_ALIGN(cfg->width, 16);
            aligned_height = MPP_ALIGN(cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            if (soc_type == ROCKCHIP_SOC_RK3399)
                aligned_height = MPP_ALIGN(cfg->height, 64);
            else if (soc_type == ROCKCHIP_SOC_RK3588)
                aligned_height = MPP_ALIGN(cfg->height, 16);
            else
                aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        case MPP_VIDEO_CodingVP8 :
        case MPP_VIDEO_CodingH263 :
        case MPP_VIDEO_CodingMPEG2 :
        case MPP_VIDEO_CodingMPEG4 : {
            aligned_height = MPP_ALIGN(cfg->height, 16);
        } break;
        case MPP_VIDEO_CodingAVS2 : {
            aligned_pixel = MPP_ALIGN(cfg->width, 64);
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        default : {
            aligned_height = MPP_ALIGN(cfg->height, 8);
        } break;
        }
        sys_cfg_dbg_dec_buf("spec aligned pixel wxh: [%d %d]\n", aligned_pixel, aligned_height);

        aligned_pixel_byte = cfg->h_stride_by_byte ? cfg->h_stride_by_byte :
                             aligned_pixel * depth / 8;

        switch (type) {
        case MPP_VIDEO_CodingHEVC : {
            aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_64, aligned_pixel_byte);
        } break;
        case MPP_VIDEO_CodingVP9 : {
            if (soc_type == ROCKCHIP_SOC_RK3576)
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64,
                                                 aligned_pixel_byte);
            else
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD, aligned_pixel_byte);
        } break;
        case MPP_VIDEO_CodingAV1 : {
            if (soc_type == ROCKCHIP_SOC_RK3588)
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_16, aligned_pixel_byte);
            else
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128, aligned_pixel_byte);
        } break;
        default : {
            aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_16, aligned_pixel_byte);
        } break;
        }
        sys_cfg_dbg_dec_buf("dec hw aligned hor_byte: [%d %d]\n", aligned_byte);

        /*
         * NOTE: rk3576 use 128 odd plus 64 for all non jpeg format
         * all the other socs use 256 odd on larger than 1080p
         */
        if ((aligned_byte > 1920 || soc_type == ROCKCHIP_SOC_RK3576 || soc_type == ROCKCHIP_SOC_RK3399)
            && type != MPP_VIDEO_CodingMJPEG) {
            rk_s32 update = 0;

            switch (soc_type) {
            case ROCKCHIP_SOC_RK3399 :
            case ROCKCHIP_SOC_RK3568 :
            case ROCKCHIP_SOC_RK3562 :
            case ROCKCHIP_SOC_RK3528 :
            case ROCKCHIP_SOC_RK3588 : {
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_256_ODD, aligned_byte);
                update = 1;
            } break;
            case ROCKCHIP_SOC_RK3576 : {
                aligned_byte = mpp_sys_cfg_align(SYS_CFG_ALIGN_128_ODD_PLUS_64, aligned_byte);
                update = 1;
            } break;
            default : {
            } break;
            }

            /*
             * recalc aligned_pixel here
             * NOTE: no RGB format here in fact
             */
            if (update) {
                switch (fmt & MPP_FRAME_FMT_MASK) {
                case MPP_FMT_YUV420SP_10BIT:
                case MPP_FMT_YUV422SP_10BIT:
                case MPP_FMT_YUV444SP_10BIT: {
                    aligned_pixel = aligned_byte * 8 / 10;
                } break;
                case MPP_FMT_YUV422_YVYU:
                case MPP_FMT_YUV422_YUYV:
                case MPP_FMT_RGB565:
                case MPP_FMT_BGR565: {
                    aligned_pixel = aligned_byte / 2;
                } break;
                case MPP_FMT_RGB888:
                case MPP_FMT_BGR888: {
                    aligned_pixel = aligned_byte / 3;
                } break;
                default : {
                    aligned_pixel = aligned_byte;
                } break;
                }
            }
        }
        sys_cfg_dbg_dec_buf("dec hw performance aligned hor_byte: [%d]\n", aligned_pixel);

        cfg->h_stride_by_byte = aligned_byte;
        cfg->h_stride_by_pixel = aligned_pixel;
        cfg->v_stride = aligned_height;

        size_total = aligned_byte * aligned_height;
        size_total_old = size_total;
        sys_cfg_dbg_dec_buf("fmt_raw %x\n", fmt_raw);
        sys_cfg_dbg_dec_buf("res aligned_pixel %d\n", aligned_pixel);
        sys_cfg_dbg_dec_buf("res aligned_byte %d\n", aligned_byte);
        sys_cfg_dbg_dec_buf("res aligned_height %d\n", aligned_height);

        switch (fmt_raw) {
        case MPP_FMT_YUV420SP :
        case MPP_FMT_YUV420SP_10BIT :
        case MPP_FMT_YUV420P :
        case MPP_FMT_YUV420SP_VU : {
            SysCfgAlignType align_type = SYS_CFG_ALIGN_LEN_DEFAULT;

            /* hevc and vp9 - SYS_CFG_ALIGN_LEN_DEFAULT */
            if (type == MPP_VIDEO_CodingAV1)
                align_type = SYS_CFG_ALIGN_LEN_420_AV1;
            else if (type == MPP_VIDEO_CodingAVC)
                align_type = SYS_CFG_ALIGN_LEN_420;

            size_total = mpp_sys_cfg_align(align_type, size_total);
        } break;
        case MPP_FMT_YUV422SP :
        case MPP_FMT_YUV422SP_10BIT :
        case MPP_FMT_YUV422P :
        case MPP_FMT_YUV422SP_VU :
        case MPP_FMT_YUV422_YUYV :
        case MPP_FMT_YUV422_YVYU :
        case MPP_FMT_YUV422_UYVY :
        case MPP_FMT_YUV422_VYUY :
        case MPP_FMT_YUV440SP :
        case MPP_FMT_YUV411SP : {
            SysCfgAlignType align_type;

            if (type == MPP_VIDEO_CodingAVC)
                align_type = SYS_CFG_ALIGN_LEN_422_AVC;
            else if (type == MPP_VIDEO_CodingAV1)
                align_type = SYS_CFG_ALIGN_LEN_422_AV1;
            else
                align_type = SYS_CFG_ALIGN_LEN_422;

            size_total = mpp_sys_cfg_align(align_type, size_total);
        } break;
        case MPP_FMT_YUV400 : {
            /* do nothing */
        } break;
        case MPP_FMT_YUV444SP :
        case MPP_FMT_YUV444P :
        case MPP_FMT_YUV444SP_10BIT : {
            size_total = mpp_sys_cfg_align(SYS_CFG_ALIGN_LEN_444, size_total);
        } break;
        default : {
            size_total = size_total * 3 / 2;
        }
        }
        sys_cfg_dbg_dec_buf("res size total %d -> %d\n", size_total_old, size_total);

        cfg->size_total = size_total;
    }

    return MPP_OK;
}